

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiInputSource IVar4;
  int iVar5;
  float *pfVar6;
  byte bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar11 [16];
  undefined1 auVar16 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  float fVar20;
  float local_8c;
  ImVec2 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  
  pIVar1 = GImGui;
  auVar17._4_60_ = in_register_00001244;
  auVar17._0_4_ = v_min;
  auVar19._4_60_ = in_register_00001204;
  auVar19._0_4_ = v_speed;
  auVar19 = ZEXT1664(auVar19._0_16_);
  uVar3 = data_type & 0xfffffffe;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) && (v_max - v_min < 3.4028235e+38))
  {
    auVar19 = ZEXT464((uint)((v_max - v_min) * GImGui->DragSpeedDefaultRatio));
  }
  uVar8 = (flags & 0x100000U) >> 0x14;
  IVar4 = GImGui->ActiveIdSource;
  auVar11 = auVar19._0_16_;
  if (IVar4 == ImGuiInputSource_Mouse) {
    bVar2 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar2) ||
       (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), !bVar2)) {
      IVar4 = pIVar1->ActiveIdSource;
      auVar19 = ZEXT1664(auVar11);
      goto LAB_0017122b;
    }
    pfVar6 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(ulong)uVar8);
    fVar20 = *pfVar6;
    if ((pIVar1->IO).KeyAlt != false) {
      fVar20 = fVar20 * 0.01;
    }
    fVar10 = auVar19._0_4_;
    if ((pIVar1->IO).KeyShift != false) {
      fVar20 = fVar20 * 10.0;
    }
  }
  else {
LAB_0017122b:
    fVar10 = auVar19._0_4_;
    fVar20 = 0.0;
    if (IVar4 == ImGuiInputSource_Nav) {
      iVar5 = 0;
      if (uVar3 == 8) {
        iVar5 = ImParseFormatPrecision(format,3);
      }
      auVar13._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar13._8_56_ = extraout_var_02;
      local_38 = (ImVec2)vmovlps_avx(auVar13._0_16_);
      pfVar6 = ImVec2::operator[](&local_38,(ulong)uVar8);
      fVar20 = *pfVar6;
      auVar14._0_4_ = GetMinimumStepAtDecimalPrecision(iVar5);
      auVar14._4_60_ = extraout_var;
      auVar12 = vcmpss_avx(auVar14._0_16_,auVar11,2);
      auVar11 = vblendvps_avx(auVar14._0_16_,auVar11,auVar12);
      fVar10 = auVar11._0_4_;
    }
  }
  bVar7 = uVar3 == 8 & (byte)((flags & 0x20U) >> 5);
  auVar11 = ZEXT416((uint)(fVar20 * fVar10));
  if ((flags & 0x100000U) != 0) {
    auVar11._0_4_ = -(fVar20 * fVar10);
    auVar11._4_4_ = 0x80000000;
    auVar11._8_4_ = 0x80000000;
    auVar11._12_4_ = 0x80000000;
  }
  if (bVar7 != 0) {
    fVar20 = v_max - v_min;
    auVar18._0_4_ = auVar11._0_4_ / fVar20;
    auVar18._4_12_ = auVar11._4_12_;
    auVar12 = vcmpss_avx(SUB6416(ZEXT464(0x358637bd),0),ZEXT416((uint)fVar20),1);
    auVar12 = vblendvps_avx(auVar11,auVar18,auVar12);
    auVar18 = vcmpss_avx(ZEXT416((uint)fVar20),ZEXT416(0x7f7fffff),1);
    auVar11 = vblendvps_avx(auVar11,auVar12,auVar18);
  }
  fVar20 = auVar11._0_4_;
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar20)) goto LAB_00171372;
    auVar11 = vcmpps_avx(auVar11,ZEXT816(0) << 0x40,1);
    auVar12 = vcmpps_avx(ZEXT416((uint)*v),auVar17._0_16_,2);
    auVar11 = vandps_avx(auVar12,auVar11);
    uVar8 = auVar11._0_4_;
  }
  else {
    uVar8 = 0;
  }
  if ((pIVar1->ActiveIdIsJustActivated == false) && ((uVar8 & 1) == 0)) {
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      pIVar1->DragCurrentAccum = fVar20 + pIVar1->DragCurrentAccum;
      pIVar1->DragCurrentAccumDirty = true;
    }
    else if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    fVar10 = *v;
    if (bVar7 == 0) {
      auVar11 = ZEXT416((uint)(fVar10 + pIVar1->DragCurrentAccum));
      local_8c = 0.0;
      fVar9 = 0.0;
    }
    else {
      iVar5 = ImParseFormatPrecision(format,3);
      fVar9 = powf(0.1,(float)iVar5);
      local_8c = ScaleRatioFromValueT<float,float,float>
                           (data_type,fVar10,v_min,v_max,true,fVar9,0.0);
      auVar15._0_4_ =
           ScaleValueFromRatioT<float,float,float>
                     (data_type,local_8c + pIVar1->DragCurrentAccum,v_min,v_max,true,fVar9,0.0);
      auVar15._4_60_ = extraout_var_00;
      auVar11 = auVar15._0_16_;
    }
    if ((flags & 0x40U) == 0) {
      auVar16._0_4_ = RoundScalarWithFormatT<float,float>(format,data_type,auVar11._0_4_);
      auVar16._4_60_ = extraout_var_01;
      auVar11 = auVar16._0_16_;
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar7 == 0) {
      fVar10 = auVar11._0_4_ - *v;
    }
    else {
      fVar10 = ScaleRatioFromValueT<float,float,float>
                         (data_type,auVar11._0_4_,v_min,v_max,true,fVar9,0.0);
      fVar10 = fVar10 - local_8c;
    }
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - fVar10;
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    auVar12 = vcmpss_avx(auVar11,auVar12,0);
    auVar11 = vandnps_avx(auVar12,auVar11);
    fVar9 = auVar11._0_4_;
    fVar10 = *v;
    if (v_min < v_max) {
      if ((fVar10 != fVar9) || (NAN(fVar10) || NAN(fVar9))) {
        if ((fVar9 < v_min) || (((uVar3 != 8 && (fVar10 < fVar9)) && (fVar20 < 0.0)))) {
          fVar9 = v_min;
        }
        if ((v_max < fVar9) || (((uVar3 != 8 && (fVar9 < fVar10)) && (0.0 < fVar20)))) {
          fVar9 = v_max;
        }
      }
    }
    if ((fVar10 == fVar9) && (!NAN(fVar10) && !NAN(fVar9))) {
      return false;
    }
    *v = fVar9;
    return true;
  }
LAB_00171372:
  pIVar1->DragCurrentAccum = 0.0;
  pIVar1->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}